

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dired.c
# Opt level: O0

int gotofile(char *fpth)

{
  int iVar1;
  bool bVar2;
  int local_434;
  char *pcStack_430;
  int tmp;
  char *p;
  char fname [1024];
  line *nlp;
  line *lp;
  char *fpth_local;
  
  xbasename((char *)&p,fpth,0x400);
  local_434 = 0;
  nlp = curbp->b_headp->l_fp;
  do {
    if (nlp == curbp->b_headp) {
LAB_0012a2ab:
      bVar2 = local_434 != curbp->b_lines + -1;
      if (bVar2) {
        eerase();
      }
      else {
        ewprintf("File not found %s",&p);
      }
      fpth_local._4_4_ = (uint)bVar2;
      return fpth_local._4_4_;
    }
    pcStack_430 = findfname(nlp,pcStack_430);
    if (pcStack_430 == (char *)0x0) {
      fname._1016_8_ = nlp->l_fp;
    }
    else {
      iVar1 = strcmp((char *)&p,pcStack_430);
      if (iVar1 == 0) {
        curwp->w_dotp = nlp;
        curwp->w_dotline = local_434 + 1;
        d_warpdot(curwp->w_dotp,&curwp->w_doto);
        goto LAB_0012a2ab;
      }
      fname._1016_8_ = nlp->l_fp;
    }
    nlp = (line *)fname._1016_8_;
    local_434 = local_434 + 1;
  } while( true );
}

Assistant:

int
gotofile(char *fpth)
{
	struct line	*lp, *nlp;
	char		 fname[NFILEN];
	char		*p;
	int		 tmp;

	(void)xbasename(fname, fpth, NFILEN);
	tmp = 0;
	for (lp = bfirstlp(curbp); lp != curbp->b_headp; lp = nlp) {
		tmp++;
		if ((p = findfname(lp, p)) == NULL) {
			nlp = lforw(lp);
			continue;
		}
		if (strcmp(fname, p) == 0) {
			curwp->w_dotp = lp;
			curwp->w_dotline = tmp;
			(void)d_warpdot(curwp->w_dotp, &curwp->w_doto);
			tmp--;
			break;
		}
		nlp = lforw(lp);
	}
	if (tmp == curbp->b_lines - 1) {
		ewprintf("File not found %s", fname);
		return (FALSE);
	} else {
		eerase();
		return (TRUE);
	}
}